

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::reallocateTo
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,size_type newCapacity)

{
  SmallVector<int,_10UL> *__last;
  EVP_PKEY_CTX *ctx;
  SmallVector<int,_10UL> *in_RSI;
  SmallVectorBase<slang::SmallVector<int,_10UL>_> *in_RDI;
  pointer newData;
  
  __last = (SmallVector<int,_10UL> *)operator_new(0x929826);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::SmallVector<int,10ul>*,slang::SmallVector<int,10ul>*>
            (in_RSI,__last,(SmallVector<int,_10UL> *)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }